

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm_reader.cpp
# Opt level: O0

void __thiscall
diffusion::ShmReader::cyclic_read(ShmReader *this,vector<char,_std::allocator<char>_> *buffer)

{
  size_type sVar1;
  char *pcVar2;
  int local_44;
  int32_t bytes_can_be_read_without_wrap;
  int32_t space_left;
  char *write_pointer;
  Size bytes_left;
  vector<char,_std::allocator<char>_> *buffer_local;
  ShmReader *this_local;
  
  sVar1 = std::vector<char,_std::allocator<char>_>::size(buffer);
  write_pointer._4_4_ = (int)sVar1;
  while (0 < write_pointer._4_4_) {
    pcVar2 = std::vector<char,_std::allocator<char>_>::data(buffer);
    sVar1 = std::vector<char,_std::allocator<char>_>::size(buffer);
    local_44 = this->shm_body_size_ - this->reader_shm_body_offset_;
    if (write_pointer._4_4_ <= local_44) {
      local_44 = write_pointer._4_4_;
    }
    memcpy(pcVar2 + (sVar1 - (long)write_pointer._4_4_),
           this->shm_body_position_ + this->reader_shm_body_offset_,(long)local_44);
    this->reader_shm_body_offset_ = local_44 + this->reader_shm_body_offset_;
    write_pointer._4_4_ = write_pointer._4_4_ - local_44;
    if (this->reader_shm_body_offset_ == this->shm_body_size_) {
      this->reader_shm_body_offset_ = 0;
    }
  }
  return;
}

Assistant:

void ShmReader::cyclic_read(std::vector<char> &buffer) {
    auto bytes_left = static_cast<Size>(buffer.size());
    while (bytes_left > 0) {
        auto write_pointer = buffer.data() + buffer.size() - bytes_left;
        auto space_left = shm_body_size_ - reader_shm_body_offset_;
        auto bytes_can_be_read_without_wrap = (bytes_left > space_left) ? space_left : bytes_left;
        std::memcpy(write_pointer, shm_body_position_ + reader_shm_body_offset_, bytes_can_be_read_without_wrap);
        reader_shm_body_offset_ += bytes_can_be_read_without_wrap;
        bytes_left -= bytes_can_be_read_without_wrap;
        if (reader_shm_body_offset_ == shm_body_size_) {
            reader_shm_body_offset_ = 0;
        }
    }
}